

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv-transpose-1d.cpp
# Opt level: O2

void load_model(test_model *model,bool use_gpu)

{
  void *pvVar1;
  char cVar2;
  int i;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ggml_backend_t pgVar14;
  ggml_backend_buffer_t pgVar15;
  ggml_context *pgVar16;
  ggml_tensor *pgVar17;
  size_t sVar18;
  undefined8 uVar19;
  undefined7 in_register_00000031;
  undefined8 in_R9;
  ulong uVar20;
  float bdata_0 [2];
  float adata_0 [3];
  ggml_tallocr alloc;
  undefined4 uStack_100d8;
  undefined7 uStack_100cf;
  float bdata_2 [6];
  float bdata_1 [6];
  float adata_1 [6];
  float adata_2 [12];
  float data [16384];
  
  adata_0[0] = 1.0;
  adata_0[1] = 2.0;
  adata_0[2] = 3.0;
  bdata_0[0] = 1.0;
  bdata_0[1] = 2.0;
  adata_1[0] = 1.0;
  adata_1[1] = 2.0;
  adata_1[2] = 3.0;
  adata_1[3] = 3.0;
  adata_1[4] = 2.0;
  adata_1[5] = 1.0;
  bdata_1[0] = 2.0;
  bdata_1[1] = 3.0;
  bdata_1[2] = 1.0;
  bdata_1[3] = 1.0;
  bdata_1[4] = 3.0;
  bdata_1[5] = 2.0;
  adata_2[8] = 3.0;
  adata_2[9] = 3.0;
  adata_2[10] = 2.0;
  adata_2[0xb] = 1.0;
  adata_2[4] = 2.0;
  adata_2[5] = 3.0;
  adata_2[6] = 1.0;
  adata_2[7] = 2.0;
  adata_2[0] = 3.0;
  adata_2[1] = 2.0;
  adata_2[2] = 1.0;
  adata_2[3] = 1.0;
  bdata_2[4] = 3.0;
  bdata_2[5] = 2.0;
  bdata_2[0] = 2.0;
  bdata_2[1] = 3.0;
  bdata_2[2] = 1.0;
  bdata_2[3] = 1.0;
  for (lVar4 = 0; lVar4 != 0x4000; lVar4 = lVar4 + 1) {
    data[lVar4] = (float)((uint)lVar4 & 0x3ff);
  }
  lVar4 = ggml_type_size(0,CONCAT71(in_register_00000031,use_gpu));
  lVar5 = ggml_type_size(0);
  lVar6 = ggml_type_size(0);
  lVar7 = ggml_type_size(0);
  lVar8 = ggml_type_size(0);
  lVar9 = ggml_type_size(0);
  lVar10 = ggml_type_size(0);
  lVar11 = ggml_type_size(0);
  lVar12 = ggml_type_size(0);
  lVar13 = ggml_type_size(0);
  uVar20 = (lVar11 + lVar9 + lVar7 + lVar6) * 6 +
           lVar4 * 3 + lVar5 * 2 + lVar12 * 0x4000 + lVar13 * 0x18a0 + (lVar10 + lVar8) * 0xc +
           0x400;
  printf("%s: ggml tensor size    = %d bytes\n","load_model",0x150);
  printf("%s: backend buffer size = %0.2f MB\n",
         SUB84((double)((float)uVar20 * 0.0009765625 * 0.0009765625),0),"load_model");
  iVar3 = ggml_tensor_overhead();
  iVar3 = iVar3 * 10;
  ggml_log_set(ggml_log_callback_default,0);
  pgVar14 = model->backend;
  if (pgVar14 == (ggml_backend_t)0x0) {
    pgVar14 = (ggml_backend_t)ggml_backend_cpu_init();
    model->backend = pgVar14;
  }
  pgVar15 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(pgVar14,uVar20);
  model->buffer = pgVar15;
  uVar19 = CONCAT71(uStack_100cf,1);
  uStack_100d8 = 0;
  pgVar16 = (ggml_context *)ggml_init();
  model->ctx = pgVar16;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_1d(pgVar16,0,3);
  model->a_0 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx,0,2);
  model->b_0 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,3,1,2,in_R9,iVar3,uStack_100d8,uVar19);
  model->a_1 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,3,2);
  model->b_1 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,3,2,2);
  model->a_2 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,3,2);
  model->b_2 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,2,3,2);
  model->a_3 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,3,2);
  model->b_3 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,0x10,0x20,0x20);
  model->a_4 = pgVar17;
  pgVar17 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,0xc5,0x20);
  model->b_4 = pgVar17;
  ggml_tallocr_new(&alloc,model->buffer);
  ggml_tallocr_alloc(&alloc,model->a_0);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->a_0;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,adata_0,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,adata_0,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->a_1);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->a_1;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,adata_1,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,adata_1,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->a_2);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->a_2;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,adata_2,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,adata_2,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->a_3);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->a_3;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,data,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,data,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->a_4);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->a_4;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,data,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,data,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->b_0);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->b_0;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,bdata_0,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,bdata_0,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->b_1);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->b_1;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,bdata_1,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,bdata_1,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->b_2);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->b_2;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,bdata_2,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,bdata_2,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->b_3);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->b_3;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,data,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,data,sVar18);
  }
  ggml_tallocr_alloc(&alloc,model->b_4);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar17 = model->b_4;
  if (cVar2 == '\0') {
    uVar19 = ggml_nbytes(pgVar17);
    ggml_backend_tensor_set(pgVar17,data,0,uVar19);
  }
  else {
    pvVar1 = pgVar17->data;
    sVar18 = ggml_nbytes(pgVar17);
    memcpy(pvVar1,data,sVar18);
  }
  return;
}

Assistant:

void load_model(test_model & model, bool use_gpu = false) {


    float adata_0[] = {1,2,3};
    float bdata_0[] = {1,2};

    float adata_1[] = {1,2,3,3,2,1};
    float bdata_1[] = {2,3,1,1,3,2};

    float adata_2[] =  {3,2,1,1,2,3,1,2,3,3,2,1};
    float bdata_2[] =  {2,3,1,1,3,2};

    float data[16*32*32];
    for (int i = 0; i < 16*32*32; ++i) {
        data[i] = (float)(i%1024);
    }




    size_t buffer_size = 0;
    {
        buffer_size += 3* ggml_type_size(GGML_TYPE_F32); // tensor a_0
        buffer_size += 2* ggml_type_size(GGML_TYPE_F32); // tensor b_0

        buffer_size += 6* ggml_type_size(GGML_TYPE_F32); // tensor a_1
        buffer_size += 6* ggml_type_size(GGML_TYPE_F32); // tensor b_1

        buffer_size += 12* ggml_type_size(GGML_TYPE_F32); // tensor a_2
        buffer_size += 6* ggml_type_size(GGML_TYPE_F32); // tensor b_2

        buffer_size += 2 * 3 * 2 * ggml_type_size(GGML_TYPE_F32); // tensor a_3
        buffer_size += 3 * 2* ggml_type_size(GGML_TYPE_F32); // tensor b_3

        buffer_size += 16 * 32 * 32 * ggml_type_size(GGML_TYPE_F32); // tensor a_4
        buffer_size += 197 * 32* ggml_type_size(GGML_TYPE_F32); // tensor b_4

        buffer_size += 1024;
    }

    printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
    printf("%s: backend buffer size = %0.2f MB\n", __func__, (buffer_size/ 1024.f/ 1024.f));

    int num_tensors = 10;
    struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
    };

    ggml_log_set(ggml_log_callback_default, nullptr);

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (use_gpu) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (use_gpu) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if(!model.backend) {
        // fallback to CPU backend
        model.backend = ggml_backend_cpu_init();
    }

    model.buffer = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // create context
    model.ctx = ggml_init(params);

    // create tensors
    model.a_0 = ggml_new_tensor_1d(model.ctx, GGML_TYPE_F32, 3);
    model.b_0 = ggml_new_tensor_1d(model.ctx, GGML_TYPE_F32, 2);


    model.a_1 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 3,1,2);
    model.b_1 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 3,2);

    model.a_2 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 3,2,2);
    model.b_2 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 3,2);

    model.a_3 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 2,3,2);
    model.b_3 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 3,2);

    model.a_4 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 16,32,32);
    model.b_4 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 197,32);


    // create a allocator
    ggml_tallocr alloc = ggml_tallocr_new(model.buffer);

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_0);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_0->data, adata_0, ggml_nbytes(model.a_0));
    } else {
        ggml_backend_tensor_set(model.a_0, adata_0, 0, ggml_nbytes(model.a_0));
    }


    // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_1);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_1->data, adata_1, ggml_nbytes(model.a_1));
    } else {
        ggml_backend_tensor_set(model.a_1, adata_1, 0, ggml_nbytes(model.a_1));
    }

     // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_2);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_2->data, adata_2, ggml_nbytes(model.a_2));
    } else {
        ggml_backend_tensor_set(model.a_2, adata_2, 0, ggml_nbytes(model.a_2));
    }

      // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_3);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_3->data, data, ggml_nbytes(model.a_3));
    } else {
        ggml_backend_tensor_set(model.a_3, data, 0, ggml_nbytes(model.a_3));
    }


      // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_4);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_4->data, data, ggml_nbytes(model.a_4));
    } else {
        ggml_backend_tensor_set(model.a_4, data, 0, ggml_nbytes(model.a_4));
    }



    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_0);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_0->data, bdata_0, ggml_nbytes(model.b_0));
    } else {
        ggml_backend_tensor_set(model.b_0, bdata_0, 0, ggml_nbytes(model.b_0));
    }

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_1);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_1->data, bdata_1, ggml_nbytes(model.b_1));
    } else {
        ggml_backend_tensor_set(model.b_1, bdata_1, 0, ggml_nbytes(model.b_1));
    }

     // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_2);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_2->data, bdata_2, ggml_nbytes(model.b_2));
    } else {
        ggml_backend_tensor_set(model.b_2, bdata_2, 0, ggml_nbytes(model.b_2));
    }

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_3);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_3->data, data, ggml_nbytes(model.b_3));
    } else {
        ggml_backend_tensor_set(model.b_3, data, 0, ggml_nbytes(model.b_3));
    }


   // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_4);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_4->data, data, ggml_nbytes(model.b_4));
    } else {
        ggml_backend_tensor_set(model.b_4, data, 0, ggml_nbytes(model.b_4));
    }


}